

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_dict.c
# Opt level: O1

ares_bool_t ares_htable_dict_get(ares_htable_dict_t *htable,char *key,char **val)

{
  ares_bool_t aVar1;
  void *pvVar2;
  
  if (val != (char **)0x0) {
    *val = (char *)0x0;
  }
  if (htable == (ares_htable_dict_t *)0x0) {
    aVar1 = ARES_FALSE;
  }
  else {
    pvVar2 = ares_htable_get(htable->hash,key);
    if (pvVar2 != (void *)0x0 && val != (char **)0x0) {
      *val = *(char **)((long)pvVar2 + 8);
      aVar1 = ARES_TRUE;
    }
    else {
      aVar1 = (ares_bool_t)(pvVar2 != (void *)0x0);
    }
  }
  return aVar1;
}

Assistant:

ares_bool_t ares_htable_dict_get(const ares_htable_dict_t *htable,
                                 const char *key, const char **val)
{
  const ares_htable_dict_bucket_t *bucket = NULL;

  if (val) {
    *val = NULL;
  }

  if (htable == NULL) {
    return ARES_FALSE;
  }

  bucket = ares_htable_get(htable->hash, key);
  if (bucket == NULL) {
    return ARES_FALSE;
  }

  if (val) {
    *val = bucket->val;
  }
  return ARES_TRUE;
}